

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfontcombobox.cpp
# Opt level: O1

void QFontComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  WritingSystem *pWVar1;
  void *pvVar2;
  QFont *font;
  QFontComboBoxPrivate *this;
  WritingSystem WVar3;
  long in_FS_OFFSET;
  void *local_48;
  void *pvStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      setCurrentFont((QFontComboBox *)_o,(QFont *)_a[1]);
    }
    else if (_id == 0) {
      pvStack_40 = _a[1];
      local_48 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
    }
    if (_c == ReadProperty) goto switchD_0040ee58_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0040ee58_caseD_3;
      goto switchD_0040ee58_caseD_5;
    }
    break;
  case ReadProperty:
switchD_0040ee58_caseD_1:
    pWVar1 = (WritingSystem *)*_a;
    if (_id == 2) {
      QFont::QFont((QFont *)&local_48,(QFont *)(*(long *)(_o + 8) + 0x358));
      pvVar2 = *(void **)pWVar1;
      *(void **)pWVar1 = local_48;
      WVar3 = pWVar1[2];
      pWVar1[2] = (WritingSystem)pvStack_40;
      pvStack_40 = (void *)CONCAT44(pvStack_40._4_4_,WVar3);
      local_48 = pvVar2;
      QFont::~QFont((QFont *)&local_48);
    }
    else {
      if (_id == 1) {
        WVar3 = *(WritingSystem *)(*(long *)(_o + 8) + 0x350);
      }
      else {
        if (_id != 0) goto LAB_0040ef57;
        WVar3 = writingSystem((QFontComboBox *)_o);
      }
      *pWVar1 = WVar3;
    }
LAB_0040ef57:
    if (_c != WriteProperty) goto switchD_0040ee58_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_0040ee58_caseD_3;
  case IndexOfMethod:
switchD_0040ee58_caseD_5:
    if ((*_a[1] == currentFontChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0040ee58_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0040ee58_caseD_3;
      goto switchD_0040ee58_caseD_1;
    }
  }
  font = (QFont *)*_a;
  if (_id == 2) {
    setCurrentFont((QFontComboBox *)_o,font);
  }
  else if (_id == 1) {
    this = *(QFontComboBoxPrivate **)(_o + 8);
    (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
    super_QFlagsStorage<QFontComboBox::FontFilter>.i = *(Int *)font;
    QFontComboBoxPrivate::updateModel(this);
  }
  else if (_id == 0) {
    setWritingSystem((QFontComboBox *)_o,*(WritingSystem *)font);
  }
switchD_0040ee58_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFontComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentFontChanged((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 1: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFontComboBox::*)(const QFont & )>(_a, &QFontComboBox::currentFontChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QFontDatabase::WritingSystem*>(_v) = _t->writingSystem(); break;
        case 1: QtMocHelpers::assignFlags<FontFilters>(_v, _t->fontFilters()); break;
        case 2: *reinterpret_cast<QFont*>(_v) = _t->currentFont(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWritingSystem(*reinterpret_cast<QFontDatabase::WritingSystem*>(_v)); break;
        case 1: _t->setFontFilters(*reinterpret_cast<FontFilters*>(_v)); break;
        case 2: _t->setCurrentFont(*reinterpret_cast<QFont*>(_v)); break;
        default: break;
        }
    }
}